

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

optional<pbrt::LightLiSample> * __thiscall
pbrt::DiffuseAreaLight::SampleLi
          (optional<pbrt::LightLiSample> *__return_storage_ptr__,DiffuseAreaLight *this,
          LightSampleContext ctx,Point2f u,SampledWavelengths lambda,LightSamplingMode mode)

{
  Float FVar1;
  undefined8 uVar2;
  uintptr_t uVar3;
  undefined1 auVar4 [16];
  float fVar5;
  Interval IVar6;
  Interval IVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  bool bVar12;
  ShapeSample *pSVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  ulong uVar20;
  undefined1 auVar19 [64];
  undefined1 auVar22 [64];
  SampledSpectrum SVar24;
  Point3f PVar25;
  Point3f PVar26;
  Vector3<float> VVar27;
  Normal3f n;
  Vector3f w;
  optional<pbrt::ShapeSample> ss;
  ShapeSampleContext shapeCtx;
  undefined1 local_f8 [16];
  SampledSpectrum local_d8;
  undefined8 local_c8;
  undefined8 uStack_c0;
  optional<pbrt::ShapeSample> local_b8;
  ShapeSampleContext local_58;
  undefined1 auVar21 [56];
  undefined1 auVar23 [56];
  
  local_58.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x =
       ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
  local_58.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y =
       ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y;
  local_58.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z =
       ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
  local_58.n.super_Tuple3<pbrt::Normal3,_float>.x = ctx.n.super_Tuple3<pbrt::Normal3,_float>.x;
  local_58.n.super_Tuple3<pbrt::Normal3,_float>.y = ctx.n.super_Tuple3<pbrt::Normal3,_float>.y;
  local_58.n.super_Tuple3<pbrt::Normal3,_float>.z = ctx.n.super_Tuple3<pbrt::Normal3,_float>.z;
  local_58.ns.super_Tuple3<pbrt::Normal3,_float>.x = ctx.ns.super_Tuple3<pbrt::Normal3,_float>.x;
  local_58.ns.super_Tuple3<pbrt::Normal3,_float>.y = ctx.ns.super_Tuple3<pbrt::Normal3,_float>.y;
  local_58.ns.super_Tuple3<pbrt::Normal3,_float>.z = ctx.ns.super_Tuple3<pbrt::Normal3,_float>.z;
  local_58.time = 0.0;
  ShapeHandle::Sample(&local_b8,&this->shape,&local_58,u);
  if (local_b8.set == true) {
    pSVar13 = pstd::optional<pbrt::ShapeSample>::value(&local_b8);
    auVar21 = (undefined1  [56])0x0;
    if ((pSVar13->pdf != 0.0) || (NAN(pSVar13->pdf))) {
      pSVar13 = pstd::optional<pbrt::ShapeSample>::value(&local_b8);
      PVar25 = Interaction::p(&pSVar13->intr);
      auVar15._0_8_ = PVar25.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar15._8_56_ = auVar21;
      PVar26 = LightSampleContext::p(&ctx);
      auVar16._0_8_ = PVar26.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar16._8_56_ = auVar21;
      auVar4 = vsubps_avx(auVar15._0_16_,auVar16._0_16_);
      fVar5 = PVar25.super_Tuple3<pbrt::Point3,_float>.z -
              PVar26.super_Tuple3<pbrt::Point3,_float>.z;
      auVar14._0_4_ = auVar4._0_4_ * auVar4._0_4_;
      auVar14._4_4_ = auVar4._4_4_ * auVar4._4_4_;
      auVar14._8_4_ = auVar4._8_4_ * auVar4._8_4_;
      auVar14._12_4_ = auVar4._12_4_ * auVar4._12_4_;
      auVar4 = vhaddps_avx(auVar14,auVar14);
      fVar5 = fVar5 * fVar5 + auVar4._0_4_;
      auVar21 = (undefined1  [56])0x0;
      if ((fVar5 != 0.0) || (NAN(fVar5))) {
        pSVar13 = pstd::optional<pbrt::ShapeSample>::value(&local_b8);
        (pSVar13->intr).mediumInterface = &(this->super_LightBase).mediumInterface;
        pSVar13 = pstd::optional<pbrt::ShapeSample>::value(&local_b8);
        PVar25 = Interaction::p(&pSVar13->intr);
        auVar17._0_8_ = PVar25.super_Tuple3<pbrt::Point3,_float>._0_8_;
        auVar17._8_56_ = auVar21;
        PVar26 = LightSampleContext::p(&ctx);
        auVar18._0_8_ = PVar26.super_Tuple3<pbrt::Point3,_float>._0_8_;
        auVar18._8_56_ = auVar21;
        auVar4 = vsubps_avx(auVar17._0_16_,auVar18._0_16_);
        uVar20 = auVar4._8_8_;
        uVar2 = vmovlps_avx(auVar4);
        local_d8.values.values[2] =
             PVar25.super_Tuple3<pbrt::Point3,_float>.z - PVar26.super_Tuple3<pbrt::Point3,_float>.z
        ;
        local_d8.values.values[0] = (float)(int)uVar2;
        local_d8.values.values[1] = (float)(int)((ulong)uVar2 >> 0x20);
        VVar27 = Normalize<float>((Vector3<float> *)&local_d8);
        local_f8._8_8_ = uVar20;
        local_f8._0_8_ = VVar27.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        pSVar13 = pstd::optional<pbrt::ShapeSample>::value(&local_b8);
        PVar25 = Interaction::p(&pSVar13->intr);
        pSVar13 = pstd::optional<pbrt::ShapeSample>::value(&local_b8);
        local_c8._0_4_ = (pSVar13->intr).n.super_Tuple3<pbrt::Normal3,_float>.x;
        local_c8._4_4_ = (pSVar13->intr).n.super_Tuple3<pbrt::Normal3,_float>.y;
        fVar5 = (pSVar13->intr).n.super_Tuple3<pbrt::Normal3,_float>.z;
        uStack_c0 = 0;
        pSVar13 = pstd::optional<pbrt::ShapeSample>::value(&local_b8);
        w.super_Tuple3<pbrt::Vector3,_float>.z = -VVar27.super_Tuple3<pbrt::Vector3,_float>.z;
        w.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
             VVar27.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
        auVar23 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
        auVar21 = ZEXT856(uVar20);
        n.super_Tuple3<pbrt::Normal3,_float>.z = fVar5;
        n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(undefined4)local_c8;
        n.super_Tuple3<pbrt::Normal3,_float>.y = (float)local_c8._4_4_;
        SVar24 = L(this,PVar25,n,(Point2f)(pSVar13->intr).uv.super_Tuple2<pbrt::Point2,_float>,w,
                   &lambda);
        auVar22._0_8_ = SVar24.values.values._8_8_;
        auVar22._8_56_ = auVar23;
        auVar19._0_8_ = SVar24.values.values._0_8_;
        auVar19._8_56_ = auVar21;
        local_d8.values.values = (array<float,_4>)vmovlhps_avx(auVar19._0_16_,auVar22._0_16_);
        bVar12 = SampledSpectrum::operator_cast_to_bool(&local_d8);
        if (bVar12) {
          pSVar13 = pstd::optional<pbrt::ShapeSample>::value(&local_b8);
          FVar1 = pSVar13->pdf;
          pSVar13 = pstd::optional<pbrt::ShapeSample>::value(&local_b8);
          (__return_storage_ptr__->optionalValue).__align =
               (anon_struct_8_0_00000001_for___align)local_d8.values.values._0_8_;
          *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) =
               local_d8.values.values._8_8_;
          IVar6 = (pSVar13->intr).pi.super_Point3<pbrt::Interval>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval>.y;
          IVar7 = (pSVar13->intr).pi.super_Point3<pbrt::Interval>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
          uVar2 = *(undefined8 *)&(pSVar13->intr).time;
          uVar8 = *(undefined8 *)&(pSVar13->intr).wo.super_Tuple3<pbrt::Vector3,_float>.y;
          uVar9 = *(undefined8 *)&(pSVar13->intr).n.super_Tuple3<pbrt::Normal3,_float>;
          uVar10 = *(undefined8 *)&(pSVar13->intr).n.super_Tuple3<pbrt::Normal3,_float>.z;
          uVar11 = *(undefined8 *)&(pSVar13->intr).uv.super_Tuple2<pbrt::Point2,_float>.y;
          *(Interval *)((long)&__return_storage_ptr__->optionalValue + 0x20) =
               (pSVar13->intr).pi.super_Point3<pbrt::Interval>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
          *(Interval *)((long)&__return_storage_ptr__->optionalValue + 0x28) = IVar6;
          *(Interval *)((long)&__return_storage_ptr__->optionalValue + 0x30) = IVar7;
          *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = uVar2;
          *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = uVar8;
          *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = uVar9;
          *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = uVar10;
          *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = uVar11;
          *(MediumInterface **)((long)&__return_storage_ptr__->optionalValue + 0x60) =
               (pSVar13->intr).mediumInterface;
          uVar3 = (pSVar13->intr).medium.
                  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                  .bits;
          __return_storage_ptr__->set = true;
          uVar2 = vmovlps_avx(local_f8);
          *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uVar2;
          *(float *)((long)&__return_storage_ptr__->optionalValue + 0x18) =
               VVar27.super_Tuple3<pbrt::Vector3,_float>.z;
          *(Float *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = FVar1;
          *(uintptr_t *)((long)&__return_storage_ptr__->optionalValue + 0x68) = uVar3;
          goto LAB_003a1dbf;
        }
      }
    }
  }
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
  *(undefined8 *)&__return_storage_ptr__->set = 0;
  (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
LAB_003a1dbf:
  pstd::optional<pbrt::ShapeSample>::~optional(&local_b8);
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<LightLiSample> DiffuseAreaLight::SampleLi(LightSampleContext ctx,
                                                         Point2f u,
                                                         SampledWavelengths lambda,
                                                         LightSamplingMode mode) const {
    // Sample point on shape for _DiffuseAreaLight_
    ShapeSampleContext shapeCtx(ctx.pi, ctx.n, ctx.ns, 0 /* time */);
    pstd::optional<ShapeSample> ss = shape.Sample(shapeCtx, u);
    if (!ss || ss->pdf == 0 || LengthSquared(ss->intr.p() - ctx.p()) == 0)
        return {};
    DCHECK(!IsNaN(ss->pdf));
    ss->intr.mediumInterface = &mediumInterface;

    // Return _LightLiSample_ for sampled point on shape
    Vector3f wi = Normalize(ss->intr.p() - ctx.p());
    SampledSpectrum Le = L(ss->intr.p(), ss->intr.n, ss->intr.uv, -wi, lambda);
    if (!Le)
        return {};
    return LightLiSample(Le, wi, ss->pdf, ss->intr);
}